

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathExtras.h
# Opt level: O0

uchar llvm::reverseBits<unsigned_char>(uchar Val)

{
  bool bVar1;
  uchar local_b;
  uint i;
  uchar out [1];
  uchar in [1];
  uchar Val_local;
  
  bVar1 = false;
  while (!bVar1) {
    local_b = BitReverseTable256[Val];
    bVar1 = true;
  }
  return local_b;
}

Assistant:

T reverseBits(T Val) {
  unsigned char in[sizeof(Val)];
  unsigned char out[sizeof(Val)];
  std::memcpy(in, &Val, sizeof(Val));
  for (unsigned i = 0; i < sizeof(Val); ++i)
    out[(sizeof(Val) - i) - 1] = BitReverseTable256[in[i]];
  std::memcpy(&Val, out, sizeof(Val));
  return Val;
}